

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O3

void Diligent::SerializationDeviceImpl::GetPipelineResourceBindingsGL
               (PipelineResourceBindingAttribs *Info,
               vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
               *ResourceBindings)

{
  pointer *ppPVar1;
  uint uVar2;
  SerializedResourceSignatureImpl *this;
  _Head_base<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_false> _Var3;
  iterator __position;
  uint uVar4;
  Uint32 i;
  SHADER_TYPE SVar5;
  uint uVar6;
  BINDING_RANGE BVar7;
  PipelineResourceSignatureDesc *pPVar8;
  PipelineResourceSignatureGLImpl *pPVar9;
  PipelineResourceDesc *Desc;
  PipelineResourceAttribsType *pPVar10;
  long lVar11;
  char (*in_RCX) [19];
  SHADER_TYPE SVar12;
  Uint32 ResIndex;
  ulong uVar13;
  char (*in_R8) [3];
  SHADER_TYPE Stages;
  Uint8 *Args;
  bool bVar14;
  string msg;
  TBindings BaseBindings;
  undefined1 local_b8 [32];
  ulong local_98;
  IPipelineResourceSignature **local_90;
  ushort local_88 [4];
  ulong local_80;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> local_78 [9];
  
  local_78[6].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[7].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[4].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[5].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[2].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[3].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[0].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  local_78[1].m_pObject = (PipelineResourceSignatureGLImpl *)0x0;
  uVar2 = Info->ResourceSignaturesCount;
  if ((ulong)uVar2 != 0) {
    local_98 = CONCAT44(local_98._4_4_,Info->ShaderStages);
    SVar5 = Info->ShaderStages & (SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS);
    local_90 = Info->ppResourceSignatures;
    uVar6 = 0;
    uVar13 = 0;
    do {
      this = (SerializedResourceSignatureImpl *)local_90[uVar13];
      if (this == (SerializedResourceSignatureImpl *)0x0) {
        FormatString<char[26],char[19]>
                  ((string *)local_b8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pSerPRS != nullptr",in_RCX);
        in_RCX = (char (*) [19])0x38;
        DebugAssertionFailed
                  ((Char *)local_b8._0_8_,"SortResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                   ,0x38);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
      }
      else {
        CheckDynamicType<Diligent::SerializedResourceSignatureImpl,Diligent::IPipelineResourceSignature>
                  ((IPipelineResourceSignature *)this);
      }
      pPVar8 = SerializedResourceSignatureImpl::GetDesc(this);
      Args = &pPVar8->BindingIndex;
      if (local_78[pPVar8->BindingIndex].m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
        FormatString<char[49],unsigned_char,char[3]>
                  ((string *)local_b8,(Diligent *)"Multiple signatures use the same binding index ("
                   ,(char (*) [49])Args,").",in_R8);
        in_RCX = (char (*) [19])0x3c;
        DebugAssertionFailed
                  ((Char *)local_b8._0_8_,"SortResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                   ,0x3c);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
      }
      _Var3._M_head_impl =
           (this->m_pDeviceSignatures)._M_elems[0]._M_t.
           super___uniq_ptr_impl<Diligent::SerializedResourceSignatureImpl::PRSWapperBase,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_std::default_delete<Diligent::SerializedResourceSignatureImpl::PRSWapperBase>_>
           .super__Head_base<0UL,_Diligent::SerializedResourceSignatureImpl::PRSWapperBase_*,_false>
           ._M_head_impl;
      if (_Var3._M_head_impl == (PRSWapperBase *)0x0) {
LAB_001e127d:
        pPVar9 = (PipelineResourceSignatureGLImpl *)0x0;
      }
      else {
        pPVar9 = (PipelineResourceSignatureGLImpl *)
                 (**(code **)((long)(_Var3._M_head_impl)->_vptr_PRSWapperBase + 0x10))();
        if (pPVar9 == (PipelineResourceSignatureGLImpl *)0x0) goto LAB_001e127d;
        CheckDynamicType<Diligent::PipelineResourceSignatureGLImpl,Diligent::IPipelineResourceSignature>
                  ((IPipelineResourceSignature *)pPVar9);
      }
      RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator=(local_78 + *Args,pPVar9);
      uVar4 = *Args + 1;
      if (*Args + 1 < uVar6) {
        uVar4 = uVar6;
      }
      uVar6 = uVar4;
      uVar13 = uVar13 + 1;
    } while (uVar2 != uVar13);
    if ((int)local_98 == 0) {
      SVar5 = SHADER_TYPE_COMPUTE|SHADER_TYPE_ALL_GRAPHICS;
    }
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    local_80 = (ulong)uVar6;
    uVar13 = 0;
    do {
      pPVar9 = local_78[uVar13].m_pObject;
      if (pPVar9 != (PipelineResourceSignatureGLImpl *)0x0) {
        if ((pPVar9->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.NumResources != 0) {
          ResIndex = 0;
          local_98 = uVar13;
          do {
            uVar13 = local_98;
            Desc = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                             (&pPVar9->
                               super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                              ResIndex);
            pPVar10 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::
                      GetResourceAttribs(&(local_78[uVar13].m_pObject)->
                                          super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>
                                         ,ResIndex);
            BVar7 = PipelineResourceToBindingRange(Desc);
            local_90 = (IPipelineResourceSignature **)CONCAT44(local_90._4_4_,ResIndex);
            if (SVar5 != SHADER_TYPE_UNKNOWN) {
              SVar12 = SVar5;
              do {
                Stages = -SVar12 & SVar12;
                if ((Desc->ShaderStages & Stages) != SHADER_TYPE_UNKNOWN) {
                  ResDescToPipelineResBinding
                            ((PipelineResourceBinding *)local_b8,Desc,Stages,
                             (uint)local_88[BVar7] + pPVar10->CacheOffset,0);
                  __position._M_current =
                       (ResourceBindings->
                       super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  if (__position._M_current ==
                      (ResourceBindings->
                      super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                    ::_M_realloc_insert<Diligent::PipelineResourceBinding>
                              (ResourceBindings,__position,(PipelineResourceBinding *)local_b8);
                  }
                  else {
                    (__position._M_current)->Space = local_b8._16_2_;
                    *(undefined2 *)&(__position._M_current)->field_0x12 = local_b8._18_2_;
                    (__position._M_current)->Register = local_b8._20_4_;
                    *(undefined8 *)&(__position._M_current)->ArraySize = local_b8._24_8_;
                    (__position._M_current)->Name = (Char *)local_b8._0_8_;
                    (__position._M_current)->ResourceType = local_b8[8];
                    *(undefined3 *)&(__position._M_current)->field_0x9 = local_b8._9_3_;
                    (__position._M_current)->ShaderStages = local_b8._12_4_;
                    ppPVar1 = &(ResourceBindings->
                               super__Vector_base<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *ppPVar1 = *ppPVar1 + 1;
                  }
                }
                bVar14 = Stages != SVar12;
                SVar12 = Stages ^ SVar12;
              } while (bVar14);
            }
            ResIndex = (int)local_90 + 1;
            pPVar9 = local_78[local_98].m_pObject;
            uVar13 = local_98;
          } while (ResIndex <
                   (pPVar9->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                   .m_Desc.NumResources);
        }
        lVar11 = 0;
        do {
          local_88[lVar11] =
               local_88[lVar11] +
               *(short *)((long)(&(pPVar9->
                                  super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>)
                                  .m_StaticResStageIndex + 5) + lVar11 * 2 + 3);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != local_80);
  }
  lVar11 = 0x38;
  do {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)
               ((long)&local_78[0].m_pObject + lVar11));
    lVar11 = lVar11 + -8;
  } while (lVar11 != -8);
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindingsGL(const PipelineResourceBindingAttribs& Info,
                                                            std::vector<PipelineResourceBinding>& ResourceBindings)
{
    const auto            ShaderStages        = (Info.ShaderStages == SHADER_TYPE_UNKNOWN ? static_cast<SHADER_TYPE>(~0u) : Info.ShaderStages);
    constexpr SHADER_TYPE SupportedStagesMask = (SHADER_TYPE_ALL_GRAPHICS | SHADER_TYPE_COMPUTE);

    SignatureArray<PipelineResourceSignatureGLImpl> Signatures      = {};
    Uint32                                          SignaturesCount = 0;
    SortResourceSignatures(Info.ppResourceSignatures, Info.ResourceSignaturesCount, Signatures, SignaturesCount);

    PipelineResourceSignatureGLImpl::TBindings BaseBindings = {};
    for (Uint32 s = 0; s < SignaturesCount; ++s)
    {
        const auto& pSignature = Signatures[s];
        if (pSignature == nullptr)
            continue;

        for (Uint32 r = 0; r < pSignature->GetTotalResourceCount(); ++r)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(r);
            const auto& ResAttr = pSignature->GetResourceAttribs(r);
            const auto  Range   = PipelineResourceToBindingRange(ResDesc);

            for (auto Stages = ShaderStages & SupportedStagesMask; Stages != 0;)
            {
                const auto ShaderStage = ExtractLSB(Stages);
                if ((ResDesc.ShaderStages & ShaderStage) == 0)
                    continue;

                ResourceBindings.push_back(ResDescToPipelineResBinding(ResDesc, ShaderStage, BaseBindings[Range] + ResAttr.CacheOffset, 0 /*space*/));
            }
        }
        pSignature->ShiftBindings(BaseBindings);
    }
}